

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_listener.cpp
# Opt level: O0

bool __thiscall zmq::ipc_listener_t::filter(ipc_listener_t *this,fd_t sock_)

{
  bool bVar1;
  int iVar2;
  reference puVar3;
  int in_ESI;
  key_type_conflict1 *in_RDI;
  char **mem;
  const_iterator end;
  const_iterator it;
  group *gr;
  passwd *pw;
  socklen_t size;
  ucred cred;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 uVar4;
  _Self in_stack_ffffffffffffff78;
  char **local_80;
  _Self local_78;
  _Self local_70;
  group *local_68;
  passwd *local_60;
  _Self local_58;
  _Self local_50;
  _Self local_48;
  _Self local_40;
  _Self local_38;
  _Self local_30;
  socklen_t local_24;
  undefined1 local_20 [4];
  __uid_t local_1c;
  int local_14;
  bool local_1;
  
  local_14 = in_ESI;
  bVar1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::empty
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     0x229283);
  if (((bVar1) &&
      (bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)0x22929e), bVar1)) &&
     (bVar1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::empty
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)0x2292b9), bVar1)) {
    local_1 = true;
  }
  else {
    local_24 = 0xc;
    iVar2 = getsockopt(local_14,1,0x11,local_20,&local_24);
    if (iVar2 == 0) {
      local_30._M_node =
           (_Base_ptr)
           std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                     (in_stack_ffffffffffffff78._M_node,in_RDI);
      local_38._M_node =
           (_Base_ptr)
           std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                     ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      bVar1 = std::operator!=(&local_30,&local_38);
      uVar4 = true;
      if (!bVar1) {
        local_40._M_node =
             (_Base_ptr)
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                       (in_stack_ffffffffffffff78._M_node,in_RDI);
        local_48._M_node =
             (_Base_ptr)
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                       ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )CONCAT17(uVar4,in_stack_ffffffffffffff68));
        bVar1 = std::operator!=(&local_40,&local_48);
        uVar4 = true;
        if (!bVar1) {
          local_50._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::find
                         (in_stack_ffffffffffffff78._M_node,(key_type_conflict *)in_RDI);
          local_58._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::end
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          CONCAT17(uVar4,in_stack_ffffffffffffff68));
          uVar4 = std::operator!=(&local_50,&local_58);
        }
      }
      if ((bool)uVar4 == false) {
        local_60 = getpwuid(local_1c);
        if (local_60 == (passwd *)0x0) {
          local_1 = false;
        }
        else {
          local_70._M_node =
               (_Base_ptr)
               std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                         ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)CONCAT17(uVar4,in_stack_ffffffffffffff68));
          local_78._M_node =
               (_Base_ptr)
               std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                         ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)CONCAT17(uVar4,in_stack_ffffffffffffff68));
          while (bVar1 = std::operator!=(&local_70,&local_78), bVar1) {
            puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                               ((_Rb_tree_const_iterator<unsigned_int> *)0x229496);
            local_68 = getgrgid(*puVar3);
            if (local_68 != (group *)0x0) {
              for (local_80 = local_68->gr_mem; *local_80 != (char *)0x0; local_80 = local_80 + 1) {
                iVar2 = strcmp(*local_80,local_60->pw_name);
                if (iVar2 == 0) {
                  return true;
                }
              }
            }
            in_stack_ffffffffffffff78 =
                 std::_Rb_tree_const_iterator<unsigned_int>::operator++
                           (in_stack_ffffffffffffff78._M_node,(int)((ulong)in_RDI >> 0x20));
          }
          local_1 = false;
        }
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool zmq::ipc_listener_t::filter (fd_t sock_)
{
    if (options.ipc_uid_accept_filters.empty ()
        && options.ipc_pid_accept_filters.empty ()
        && options.ipc_gid_accept_filters.empty ())
        return true;

    struct ucred cred;
    socklen_t size = sizeof (cred);

    if (getsockopt (sock_, SOL_SOCKET, SO_PEERCRED, &cred, &size))
        return false;
    if (options.ipc_uid_accept_filters.find (cred.uid)
          != options.ipc_uid_accept_filters.end ()
        || options.ipc_gid_accept_filters.find (cred.gid)
             != options.ipc_gid_accept_filters.end ()
        || options.ipc_pid_accept_filters.find (cred.pid)
             != options.ipc_pid_accept_filters.end ())
        return true;

    const struct passwd *pw;
    const struct group *gr;

    if (!(pw = getpwuid (cred.uid)))
        return false;
    for (options_t::ipc_gid_accept_filters_t::const_iterator
           it = options.ipc_gid_accept_filters.begin (),
           end = options.ipc_gid_accept_filters.end ();
         it != end; it++) {
        if (!(gr = getgrgid (*it)))
            continue;
        for (char **mem = gr->gr_mem; *mem; mem++) {
            if (!strcmp (*mem, pw->pw_name))
                return true;
        }
    }
    return false;
}